

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ATree(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint local_40;
  int fVeryVerbose;
  int fVerbose;
  int fAddCones;
  int fAddExtra;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 0;
  fVeryVerbose = 0;
  local_40 = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_002c130e:
  iVar2 = Extra_UtilGetopt(argc,argv,"ecvwh");
  if (iVar2 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Esop(): There is no AIG.\n");
    }
    else {
      pNew = Gia_PolynCoreDetectTest(pAbc->pGia,fVerbose,fVeryVerbose,local_40);
      Abc_FrameUpdateGia(pAbc,pNew);
    }
    return 0;
  }
  switch(iVar2) {
  case 99:
    fVeryVerbose = fVeryVerbose ^ 1;
    goto LAB_002c130e;
  default:
    break;
  case 0x65:
    fVerbose = fVerbose ^ 1;
    goto LAB_002c130e;
  case 0x68:
    break;
  case 0x76:
    local_40 = local_40 ^ 1;
    goto LAB_002c130e;
  case 0x77:
    goto switchD_002c134c_caseD_77;
  }
  Abc_Print(-2,"usage: &atree [-ecvwh]\n");
  Abc_Print(-2,"\t         extracts adder tree rooting in primary outputs\n");
  pcVar3 = "no";
  if (fVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-e     : toggles adding extra outputs [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fVeryVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-c     : toggles duplicating complete AIG [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (local_40 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-w     : toggles printing very verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_002c134c_caseD_77:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_002c130e;
}

Assistant:

int Abc_CommandAbc9ATree( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_PolynCoreDetectTest( Gia_Man_t * pGia, int fAddExtra, int fAddCones, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int c, fAddExtra = 0, fAddCones = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ecvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'e':
            fAddExtra ^= 1;
            break;
        case 'c':
            fAddCones ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Esop(): There is no AIG.\n" );
        return 0;
    }
    pTemp = Gia_PolynCoreDetectTest( pAbc->pGia, fAddExtra, fAddCones, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &atree [-ecvwh]\n" );
    Abc_Print( -2, "\t         extracts adder tree rooting in primary outputs\n" );
    Abc_Print( -2, "\t-e     : toggles adding extra outputs [default = %s]\n",  fAddExtra? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggles duplicating complete AIG [default = %s]\n",  fAddCones? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggles printing very verbose information [default = %s]\n",  fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}